

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::andIntToReg(CodeGen *codeGen,ExtendedRegisters dest,int value)

{
  ulong local_28;
  size_t i;
  IntToBytes converter;
  ExtendedRegisters local_11;
  int value_local;
  ExtendedRegisters dest_local;
  CodeGen *codeGen_local;
  
  i._7_1_ = 0x49;
  converter.intValue = value;
  local_11 = dest;
  _value_local = codeGen;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (codeGen,(value_type_conflict1 *)((long)&i + 7));
  i._6_1_ = 0x81;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_value_local,(value_type_conflict1 *)((long)&i + 6));
  i._5_1_ = local_11 | 0xe0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (_value_local,(value_type_conflict1 *)((long)&i + 5));
  i._0_4_ = converter;
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_value_local,(value_type_conflict1 *)((long)&i + local_28));
  }
  return;
}

Assistant:

void Amd64Backend::andIntToReg(CodeGen& codeGen, ExtendedRegisters dest, int value) {
		codeGen.push_back(0x49);
		codeGen.push_back(0x81);
		codeGen.push_back(0xe0 | (Byte)dest);

		IntToBytes converter;
		converter.intValue = value;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}